

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[2],capnp::Text::Reader&,char_const(&)[27]>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],Reader *params_1,
          char (*params_2) [27])

{
  char (*value) [2];
  Reader *value_00;
  char (*value_01) [27];
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  Reader *local_28;
  char (*params_local_2) [27];
  Reader *params_local_1;
  char (*params_local) [2];
  
  local_28 = params_1;
  params_local_2 = (char (*) [27])params;
  params_local_1 = (Reader *)this;
  params_local = (char (*) [2])__return_storage_ptr__;
  value = ::const((char (*) [2])this);
  local_38 = toCharSequence<char_const(&)[2]>(value);
  value_00 = fwd<capnp::Text::Reader&>((Reader *)params_local_2);
  local_48 = toCharSequence<capnp::Text::Reader&>(value_00);
  value_01 = ::const((char (*) [27])local_28);
  local_58 = toCharSequence<char_const(&)[27]>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}